

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memjrnlTruncate(sqlite3_file *pJfd,sqlite_int64 size)

{
  sqlite3_io_methods *psVar1;
  sqlite3_io_methods *p_00;
  MemJournal *p;
  
  if (size == 0) {
    p_00 = pJfd[3].pMethods;
    while (p_00 != (sqlite3_io_methods *)0x0) {
      psVar1 = *(sqlite3_io_methods **)p_00;
      sqlite3_free(p_00);
      p_00 = psVar1;
    }
    *(undefined4 *)&pJfd[2].pMethods = 0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
  }
  return 0;
}

Assistant:

static int memjrnlTruncate(sqlite3_file *pJfd, sqlite_int64 size){
  MemJournal *p = (MemJournal *)pJfd;
  if( ALWAYS(size==0) ){
    memjrnlFreeChunks(p);
    p->nSize = 0;
    p->endpoint.pChunk = 0;
    p->endpoint.iOffset = 0;
    p->readpoint.pChunk = 0;
    p->readpoint.iOffset = 0;
  }
  return SQLITE_OK;
}